

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnMemory
          (BinaryReaderObjdump *this,Index index,Limits *page_limits,uint32_t page_size)

{
  PrintDetails(this," - memory[%u] pages: initial=%ld",index,page_limits->initial);
  if (page_limits->has_max == true) {
    PrintDetails(this," max=%ld",page_limits->max);
  }
  if (page_limits->is_shared == true) {
    PrintDetails(this," shared");
  }
  if (page_limits->is_64 == true) {
    PrintDetails(this," i64");
  }
  if (page_size != 0x10000) {
    PrintDetails(this," (pagesize %u)",(ulong)page_size);
  }
  PrintDetails(this,"\n");
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnMemory(Index index,
                                     const Limits* page_limits,
                                     uint32_t page_size) {
  PrintDetails(" - memory[%" PRIindex "] pages: initial=%" PRId64, index,
               page_limits->initial);
  if (page_limits->has_max) {
    PrintDetails(" max=%" PRId64, page_limits->max);
  }
  if (page_limits->is_shared) {
    PrintDetails(" shared");
  }
  if (page_limits->is_64) {
    PrintDetails(" i64");
  }
  if (page_size != WABT_DEFAULT_PAGE_SIZE) {
    PrintDetails(" (pagesize %u)", page_size);
  }
  PrintDetails("\n");
  return Result::Ok;
}